

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_compilation.cpp
# Opt level: O2

parser<pstore::exchange::import_ns::callbacks> *
anon_unknown.dwarf_9d963::import_compilation_parser
          (parser<pstore::exchange::import_ns::callbacks> *__return_storage_ptr__,
          transaction *transaction,string_mapping *names,
          shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
          *fragment_index,digest *digest)

{
  reference_wrapper<const_std::shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>_>
  unaff_RBP;
  string_mapping *unaff_R13;
  transaction<std::unique_lock<mock_mutex>_> *unaff_R14;
  reference_wrapper<const_pstore::uint128> unaff_R15;
  not_null<pstore::database_*> unaff_retaddr;
  callbacks cStack_48;
  not_null<pstore::database_*> local_38;
  
  local_38.ptr_ = (transaction->super_transaction_base).db_;
  pstore::gsl::not_null<pstore::database_*>::ensure_invariant(&local_38);
  pstore::exchange::import_ns::callbacks::
  make<pstore::exchange::import_ns::object_rule<pstore::exchange::import_ns::compilation,pstore::transaction<std::unique_lock<mock_mutex>>*,pstore::exchange::import_ns::string_mapping*,std::reference_wrapper<std::shared_ptr<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>const>,std::reference_wrapper<pstore::uint128_const>>,pstore::transaction<std::unique_lock<mock_mutex>>*,pstore::exchange::import_ns::string_mapping*,std::reference_wrapper<std::shared_ptr<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>const>,std::reference_wrapper<pstore::uint128_const>>
            (unaff_retaddr,unaff_R14,unaff_R13,unaff_RBP,unaff_R15);
  pstore::json::make_parser<pstore::exchange::import_ns::callbacks>
            (__return_storage_ptr__,&cStack_48,none);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&cStack_48.context_.
              super___shared_ptr<pstore::exchange::import_ns::context,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return __return_storage_ptr__;
}

Assistant:

decltype (auto) import_compilation_parser (
        transaction * const transaction, pstore::exchange::import_ns::string_mapping * const names,
        std::shared_ptr<pstore::index::fragment_index> const & fragment_index,
        pstore::index::digest const & digest) {
        return make_json_object_parser<pstore::exchange::import_ns::compilation> (
            &transaction->db (), transaction, names, std::cref (fragment_index),
            std::cref (digest));
    }